

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar3;
  Real a;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  fpclass_type fVar8;
  int iVar9;
  int32_t *piVar10;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar11;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  int *local_a0;
  cpp_dec_float<50U,_int,_void> local_98;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  undefined8 uStack_40;
  
  local_228.fpclass = cpp_dec_float_finite;
  local_228.prec_elem = 10;
  local_228.data._M_elems[0] = 0;
  local_228.data._M_elems[1] = 0;
  local_228.data._M_elems[2] = 0;
  local_228.data._M_elems[3] = 0;
  local_228.data._M_elems[4] = 0;
  local_228.data._M_elems[5] = 0;
  local_228.data._M_elems[6] = 0;
  local_228.data._M_elems[7] = 0;
  local_228.data._M_elems[8] = 0;
  local_228.data._M_elems[9] = 0;
  local_228.exp = 0;
  local_228.neg = false;
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.exp = 0;
  local_128.neg = false;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_b0 = (cpp_dec_float<50U,_int,_void> *)this;
  a = Tolerances::epsilon(this_00);
  local_98.fpclass = cpp_dec_float_finite;
  local_98.prec_elem = 10;
  local_98.data._M_elems[0] = 0;
  local_98.data._M_elems[1] = 0;
  local_98.data._M_elems[2] = 0;
  local_98.data._M_elems[3] = 0;
  local_98.data._M_elems[4] = 0;
  local_98.data._M_elems[5] = 0;
  local_98.data._M_elems._24_5_ = 0;
  local_98.data._M_elems[7]._1_3_ = 0;
  local_98.data._M_elems._32_5_ = 0;
  local_98.data._M_elems[9]._1_3_ = 0;
  local_98.exp = 0;
  local_98.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_98,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_e8.data._M_elems._32_5_ = SUB85(uVar3,0);
  local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
  local_e8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_e8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_e8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_e8.data._M_elems._24_5_ = SUB85(uVar3,0);
  local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
  local_e8.exp = (val->m_backend).exp;
  local_e8.neg = (val->m_backend).neg;
  local_e8.fpclass = (val->m_backend).fpclass;
  local_e8.prec_elem = (val->m_backend).prec_elem;
  local_a8 = val;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_128,0);
  if (num != 0) {
    local_b0 = &(((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_b0->data)->delta).m_backend;
    local_48 = *(double *)(in_FS_OFFSET + -8);
    local_58 = SUB84(local_48,0);
    uStack_40 = 0;
    uStack_54 = (uint)((ulong)local_48 >> 0x20) ^ 0x80000000;
    uStack_50 = 0;
    uStack_4c = 0x80000000;
    lVar11 = (long)num;
    local_a0 = idx;
    do {
      piVar10 = &local_128.prec_elem;
      iVar9 = idx[lVar11 + -1];
      uVar3 = *(undefined8 *)(upd[iVar9].m_backend.data._M_elems + 8);
      local_228.data._M_elems[8] = (uint)uVar3;
      local_228.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)upd[iVar9].m_backend.data._M_elems;
      uVar4 = *(undefined8 *)(upd[iVar9].m_backend.data._M_elems + 2);
      puVar2 = upd[iVar9].m_backend.data._M_elems + 4;
      uVar5 = *(undefined8 *)puVar2;
      uVar6 = *(undefined8 *)(puVar2 + 2);
      local_228.data._M_elems[4] = (uint)uVar5;
      local_228.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
      local_228.data._M_elems[6] = (uint)uVar6;
      local_228.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
      local_228.data._M_elems[0] = (uint)uVar3;
      local_228.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
      local_228.data._M_elems[2] = (uint)uVar4;
      local_228.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
      local_228.exp = upd[iVar9].m_backend.exp;
      local_228.neg = upd[iVar9].m_backend.neg;
      local_228.fpclass = upd[iVar9].m_backend.fpclass;
      local_228.prec_elem = upd[iVar9].m_backend.prec_elem;
      if (local_98.fpclass == cpp_dec_float_NaN || local_228.fpclass == cpp_dec_float_NaN) {
LAB_002ad3da:
        local_1e8.data._M_elems[0] = local_98.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_98.data._M_elems[1];
        uVar3 = local_1e8.data._M_elems._0_8_;
        local_1e8.data._M_elems[2] = local_98.data._M_elems[2];
        local_1e8.data._M_elems[3] = local_98.data._M_elems[3];
        local_1e8.data._M_elems._32_5_ = local_98.data._M_elems._32_5_;
        local_1e8.data._M_elems[9]._1_3_ = local_98.data._M_elems[9]._1_3_;
        local_1e8.data._M_elems[4] = local_98.data._M_elems[4];
        local_1e8.data._M_elems[5] = local_98.data._M_elems[5];
        local_1e8.data._M_elems._24_5_ = local_98.data._M_elems._24_5_;
        local_1e8.data._M_elems[7]._1_3_ = local_98.data._M_elems[7]._1_3_;
        local_1e8.exp = local_98.exp;
        local_1e8.neg = local_98.neg;
        local_1e8.prec_elem = local_98.prec_elem;
        local_1e8.fpclass = local_98.fpclass;
        local_1e8.data._M_elems[0] = local_98.data._M_elems[0];
        if (local_1e8.data._M_elems[0] != 0 || local_98.fpclass != cpp_dec_float_finite) {
          local_1e8.neg = (bool)(local_98.neg ^ 1);
        }
        local_1e8.data._M_elems._0_8_ = uVar3;
        if (((local_98.fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_228,&local_1e8), iVar7 < 0)) {
          local_1e8.data._M_elems[1] = local_228.data._M_elems[1];
          local_1e8.data._M_elems[0] = local_228.data._M_elems[0];
          local_1e8.data._M_elems[3] = local_228.data._M_elems[3];
          local_1e8.data._M_elems[2] = local_228.data._M_elems[2];
          local_1e8.data._M_elems[5] = local_228.data._M_elems[5];
          local_1e8.data._M_elems[4] = local_228.data._M_elems[4];
          local_1e8.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_228.data._M_elems[9],local_228.data._M_elems[8]),0);
          local_1e8.data._M_elems[9]._1_3_ = (undefined3)(local_228.data._M_elems[9] >> 8);
          local_1e8.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_228.data._M_elems[7],local_228.data._M_elems[6]),0);
          local_1e8.data._M_elems[7]._1_3_ = (undefined3)(local_228.data._M_elems[7] >> 8);
          local_1e8.exp = local_228.exp;
          local_1e8.neg = local_228.neg;
          local_1e8.fpclass = local_228.fpclass;
          local_1e8.prec_elem = local_228.prec_elem;
          if (local_228.data._M_elems[0] != 0 || local_228.fpclass != cpp_dec_float_finite) {
            local_1e8.neg = (bool)(local_228.neg ^ 1);
          }
          if (local_128.fpclass == cpp_dec_float_NaN || local_228.fpclass == cpp_dec_float_NaN) {
LAB_002ad7db:
            local_168.data._M_elems[0] = local_128.data._M_elems[1];
            local_168.data._M_elems[1] = local_128.data._M_elems[2];
            local_168.data._M_elems[2] = local_128.data._M_elems[3];
            local_168.data._M_elems[3] = local_128.data._M_elems[4];
            local_168.data._M_elems[4] = local_128.data._M_elems[5];
            local_168.data._M_elems[5] = local_128.data._M_elems[6];
            local_168.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_128.data._M_elems[8],local_128.data._M_elems[7]),0);
            local_168.data._M_elems[7]._1_3_ = (undefined3)(local_128.data._M_elems[8] >> 8);
            local_168.data._M_elems[8] = local_128.data._M_elems[9];
          }
          else {
            iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1e8,&local_128);
            if (iVar7 < 1) {
              goto LAB_002ad7db;
            }
            local_168.data._M_elems[0] = local_228.data._M_elems[1];
            local_168.data._M_elems[1] = local_228.data._M_elems[2];
            local_168.data._M_elems[2] = local_228.data._M_elems[3];
            local_168.data._M_elems[3] = local_228.data._M_elems[4];
            local_168.data._M_elems[4] = local_228.data._M_elems[5];
            local_168.data._M_elems[5] = local_228.data._M_elems[6];
            local_168.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_228.data._M_elems[8],local_228.data._M_elems[7]),0);
            local_168.data._M_elems[7]._1_3_ = (undefined3)(local_228.data._M_elems[8] >> 8);
            local_168.data._M_elems[8] = local_228.data._M_elems[9];
            local_128.exp = local_228.exp;
            local_128.prec_elem = local_228.prec_elem;
            if (local_228.fpclass == cpp_dec_float_finite && local_228.data._M_elems[0] == 0) {
              local_128.fpclass = cpp_dec_float_finite;
              local_128.neg = local_228.neg;
              local_128.data._M_elems[0] = 0;
            }
            else {
              local_128.neg = (bool)(local_228.neg ^ 1);
              local_128.fpclass = local_228.fpclass;
              local_128.data._M_elems[0] = local_228.data._M_elems[0];
            }
          }
          local_128.data._M_elems[9] = local_168.data._M_elems[8];
          local_128.data._M_elems[5] = local_168.data._M_elems[4];
          local_128.data._M_elems[6] = local_168.data._M_elems[5];
          local_128.data._M_elems[7] = local_168.data._M_elems[6];
          local_128.data._M_elems[8] =
               (uint)(CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_) >>
                     0x20);
          local_128.data._M_elems[1] = local_168.data._M_elems[0];
          local_128.data._M_elems[2] = local_168.data._M_elems[1];
          local_128.data._M_elems[3] = local_168.data._M_elems[2];
          local_128.data._M_elems[4] = local_168.data._M_elems[3];
          pcVar1 = &low[iVar9].m_backend;
          local_1a8.fpclass = cpp_dec_float_finite;
          local_1a8.prec_elem = 10;
          local_1a8.data._M_elems[0] = 0;
          local_1a8.data._M_elems[1] = 0;
          local_1a8.data._M_elems[2] = 0;
          local_1a8.data._M_elems[3] = 0;
          local_1a8.data._M_elems[4] = 0;
          local_1a8.data._M_elems[5] = 0;
          local_1a8.data._M_elems._24_5_ = 0;
          local_1a8.data._M_elems[7]._1_3_ = 0;
          local_1a8.data._M_elems._32_5_ = 0;
          local_1a8.data._M_elems[9]._1_3_ = 0;
          local_1a8.exp = 0;
          local_1a8.neg = false;
          if (&local_1a8 == &vec[iVar9].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_1a8,pcVar1);
            if (local_1a8.data._M_elems[0] != 0 || local_1a8.fpclass != cpp_dec_float_finite) {
              local_1a8.neg = (bool)(local_1a8.neg ^ 1);
            }
          }
          else {
            if (&local_1a8 != pcVar1) {
              uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
              local_1a8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_1a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_1a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
              local_1a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
              local_1a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
              local_1a8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_1a8.exp = pcVar1->exp;
              local_1a8.neg = pcVar1->neg;
              local_1a8.fpclass = pcVar1->fpclass;
              local_1a8.prec_elem = pcVar1->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_1a8,&vec[iVar9].m_backend);
          }
          local_168.fpclass = cpp_dec_float_finite;
          local_168.prec_elem = 10;
          local_168.data._M_elems[0] = 0;
          local_168.data._M_elems[1] = 0;
          local_168.data._M_elems[2] = 0;
          local_168.data._M_elems[3] = 0;
          local_168.data._M_elems[4] = 0;
          local_168.data._M_elems[5] = 0;
          local_168.data._M_elems._24_5_ = 0;
          local_168.data._M_elems[7]._1_3_ = 0;
          local_168.data._M_elems[8] = 0;
          local_168.data._M_elems[9] = 0;
          local_168.exp = 0;
          local_168.neg = false;
          if (&local_168 == local_b0) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_168,&local_1a8);
            if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
              local_168.neg = (bool)(local_168.neg ^ 1);
            }
          }
          else {
            local_168.data._M_elems[8] = local_1a8.data._M_elems[8];
            local_168.data._M_elems[9] =
                 (uint)(CONCAT35(local_1a8.data._M_elems[9]._1_3_,local_1a8.data._M_elems._32_5_) >>
                       0x20);
            local_168.data._M_elems[4] = local_1a8.data._M_elems[4];
            local_168.data._M_elems[5] = local_1a8.data._M_elems[5];
            local_168.data._M_elems._24_5_ = local_1a8.data._M_elems._24_5_;
            local_168.data._M_elems[7]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
            local_168.data._M_elems[0] = local_1a8.data._M_elems[0];
            local_168.data._M_elems[1] = local_1a8.data._M_elems[1];
            local_168.data._M_elems[2] = local_1a8.data._M_elems[2];
            local_168.data._M_elems[3] = local_1a8.data._M_elems[3];
            local_168.exp = local_1a8.exp;
            local_168.neg = local_1a8.neg;
            local_168.fpclass = local_1a8.fpclass;
            local_168.prec_elem = local_1a8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_168,local_b0);
          }
          local_1e8.fpclass = cpp_dec_float_finite;
          local_1e8.prec_elem = 10;
          local_1e8.data._M_elems[0] = 0;
          local_1e8.data._M_elems[1] = 0;
          local_1e8.data._M_elems[2] = 0;
          local_1e8.data._M_elems[3] = 0;
          local_1e8.data._M_elems[4] = 0;
          local_1e8.data._M_elems[5] = 0;
          local_1e8.data._M_elems._24_5_ = 0;
          local_1e8.data._M_elems[7]._1_3_ = 0;
          local_1e8.data._M_elems._32_5_ = 0;
          local_1e8.data._M_elems[9]._1_3_ = 0;
          local_1e8.exp = 0;
          local_1e8.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1e8,&local_168,&local_228);
          local_228.data._M_elems[8] = local_1e8.data._M_elems[8];
          local_228.data._M_elems[9] =
               (uint)(CONCAT35(local_1e8.data._M_elems[9]._1_3_,local_1e8.data._M_elems._32_5_) >>
                     0x20);
          local_228.data._M_elems[4] = local_1e8.data._M_elems[4];
          local_228.data._M_elems[5] = local_1e8.data._M_elems[5];
          local_228.data._M_elems[6] = local_1e8.data._M_elems[6];
          local_228.data._M_elems[7] =
               (uint)(CONCAT35(local_1e8.data._M_elems[7]._1_3_,local_1e8.data._M_elems._24_5_) >>
                     0x20);
          local_228.data._M_elems[0] = local_1e8.data._M_elems[0];
          local_228.data._M_elems[1] = local_1e8.data._M_elems[1];
          local_228.data._M_elems[2] = local_1e8.data._M_elems[2];
          local_228.data._M_elems[3] = local_1e8.data._M_elems[3];
          local_228.exp = local_1e8.exp;
          local_228.neg = local_1e8.neg;
          local_228.fpclass = local_1e8.fpclass;
          local_228.prec_elem = local_1e8.prec_elem;
          if (((local_1e8.fpclass != cpp_dec_float_NaN) && (local_e8.fpclass != cpp_dec_float_NaN))
             && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_228,&local_e8), iVar9 < 0)) {
            ::soplex::infinity::__tls_init();
            local_1e8.fpclass = cpp_dec_float_finite;
            local_1e8.prec_elem = 10;
            local_1e8.data._M_elems[0] = 0;
            local_1e8.data._M_elems[1] = 0;
            local_1e8.data._M_elems[2] = 0;
            local_1e8.data._M_elems[3] = 0;
            local_1e8.data._M_elems[4] = 0;
            local_1e8.data._M_elems[5] = 0;
            local_1e8.data._M_elems._24_5_ = 0;
            local_1e8.data._M_elems[7]._1_3_ = 0;
            local_1e8.data._M_elems._32_5_ = 0;
            local_1e8.data._M_elems[9]._1_3_ = 0;
            local_1e8.exp = 0;
            local_1e8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1e8,
                       (double)CONCAT44(uStack_54,local_58));
            if (((pcVar1->fpclass != cpp_dec_float_NaN) && (local_1e8.fpclass != cpp_dec_float_NaN))
               && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar1,&local_1e8), 0 < iVar9)) goto LAB_002adaf8;
          }
        }
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_228,&local_98);
        if (iVar7 < 1) {
          goto LAB_002ad3da;
        }
        fVar8 = local_128.fpclass;
        if (local_128.fpclass != cpp_dec_float_NaN && local_228.fpclass != cpp_dec_float_NaN) {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_228,&local_128);
          if (iVar7 < 1) {
            fVar8 = local_128.fpclass;
          }
          else {
            local_128.data._M_elems[8] = local_228.data._M_elems[8];
            local_128.data._M_elems[9] = local_228.data._M_elems[9];
            local_128.data._M_elems[4] = local_228.data._M_elems[4];
            local_128.data._M_elems[5] = local_228.data._M_elems[5];
            local_128.data._M_elems[6] = local_228.data._M_elems[6];
            local_128.data._M_elems[7] = local_228.data._M_elems[7];
            local_128.data._M_elems[0] = local_228.data._M_elems[0];
            local_128.data._M_elems[1] = local_228.data._M_elems[1];
            local_128.data._M_elems[2] = local_228.data._M_elems[2];
            local_128.data._M_elems[3] = local_228.data._M_elems[3];
            local_128.exp = local_228.exp;
            local_128.neg = local_228.neg;
            piVar10 = &local_228.prec_elem;
            fVar8 = local_228.fpclass;
          }
        }
        local_128.fpclass = fVar8;
        local_128.prec_elem = *piVar10;
        pcVar1 = &up[iVar9].m_backend;
        local_1a8.fpclass = cpp_dec_float_finite;
        local_1a8.prec_elem = 10;
        local_1a8.data._M_elems[0] = 0;
        local_1a8.data._M_elems[1] = 0;
        local_1a8.data._M_elems[2] = 0;
        local_1a8.data._M_elems[3] = 0;
        local_1a8.data._M_elems[4] = 0;
        local_1a8.data._M_elems[5] = 0;
        local_1a8.data._M_elems._24_5_ = 0;
        local_1a8.data._M_elems[7]._1_3_ = 0;
        local_1a8.data._M_elems._32_5_ = 0;
        local_1a8.data._M_elems[9]._1_3_ = 0;
        local_1a8.exp = 0;
        local_1a8.neg = false;
        if (&local_1a8 == &vec[iVar9].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1a8,pcVar1);
          if (local_1a8.data._M_elems[0] != 0 || local_1a8.fpclass != cpp_dec_float_finite) {
            local_1a8.neg = (bool)(local_1a8.neg ^ 1);
          }
        }
        else {
          if (&local_1a8 != pcVar1) {
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_1a8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_1a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_1a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_1a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_1a8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1a8.exp = pcVar1->exp;
            local_1a8.neg = pcVar1->neg;
            local_1a8.fpclass = pcVar1->fpclass;
            local_1a8.prec_elem = pcVar1->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1a8,&vec[iVar9].m_backend);
        }
        local_168.fpclass = cpp_dec_float_finite;
        local_168.prec_elem = 10;
        local_168.data._M_elems[0] = 0;
        local_168.data._M_elems[1] = 0;
        local_168.data._M_elems[2] = 0;
        local_168.data._M_elems[3] = 0;
        local_168.data._M_elems[4] = 0;
        local_168.data._M_elems[5] = 0;
        local_168.data._M_elems._24_5_ = 0;
        local_168.data._M_elems[7]._1_3_ = 0;
        local_168.data._M_elems[8] = 0;
        local_168.data._M_elems[9] = 0;
        local_168.exp = 0;
        local_168.neg = false;
        v = &local_1a8;
        if (&local_168 != local_b0) {
          local_168.data._M_elems[8] = local_1a8.data._M_elems[8];
          local_168.data._M_elems[9] =
               (uint)(CONCAT35(local_1a8.data._M_elems[9]._1_3_,local_1a8.data._M_elems._32_5_) >>
                     0x20);
          local_168.data._M_elems[4] = local_1a8.data._M_elems[4];
          local_168.data._M_elems[5] = local_1a8.data._M_elems[5];
          local_168.data._M_elems._24_5_ = local_1a8.data._M_elems._24_5_;
          local_168.data._M_elems[7]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
          local_168.data._M_elems[0] = local_1a8.data._M_elems[0];
          local_168.data._M_elems[1] = local_1a8.data._M_elems[1];
          local_168.data._M_elems[2] = local_1a8.data._M_elems[2];
          local_168.data._M_elems[3] = local_1a8.data._M_elems[3];
          local_168.exp = local_1a8.exp;
          local_168.neg = local_1a8.neg;
          local_168.fpclass = local_1a8.fpclass;
          local_168.prec_elem = local_1a8.prec_elem;
          v = local_b0;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_168,v);
        local_1e8.fpclass = cpp_dec_float_finite;
        local_1e8.prec_elem = 10;
        local_1e8.data._M_elems[0] = 0;
        local_1e8.data._M_elems[1] = 0;
        local_1e8.data._M_elems[2] = 0;
        local_1e8.data._M_elems[3] = 0;
        local_1e8.data._M_elems[4] = 0;
        local_1e8.data._M_elems[5] = 0;
        local_1e8.data._M_elems._24_5_ = 0;
        local_1e8.data._M_elems[7]._1_3_ = 0;
        local_1e8.data._M_elems._32_5_ = 0;
        local_1e8.data._M_elems[9]._1_3_ = 0;
        local_1e8.exp = 0;
        local_1e8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1e8,&local_168,&local_228);
        idx = local_a0;
        local_228.data._M_elems[8] = local_1e8.data._M_elems[8];
        local_228.data._M_elems[9] =
             (uint)(CONCAT35(local_1e8.data._M_elems[9]._1_3_,local_1e8.data._M_elems._32_5_) >>
                   0x20);
        local_228.data._M_elems[4] = local_1e8.data._M_elems[4];
        local_228.data._M_elems[5] = local_1e8.data._M_elems[5];
        local_228.data._M_elems[6] = local_1e8.data._M_elems[6];
        local_228.data._M_elems[7] =
             (uint)(CONCAT35(local_1e8.data._M_elems[7]._1_3_,local_1e8.data._M_elems._24_5_) >>
                   0x20);
        local_228.data._M_elems[0] = local_1e8.data._M_elems[0];
        local_228.data._M_elems[1] = local_1e8.data._M_elems[1];
        local_228.data._M_elems[2] = local_1e8.data._M_elems[2];
        local_228.data._M_elems[3] = local_1e8.data._M_elems[3];
        local_228.exp = local_1e8.exp;
        local_228.neg = local_1e8.neg;
        local_228.fpclass = local_1e8.fpclass;
        local_228.prec_elem = local_1e8.prec_elem;
        if (((local_1e8.fpclass == cpp_dec_float_NaN) || (local_e8.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_228,&local_e8), -1 < iVar9)) goto LAB_002ada82;
        ::soplex::infinity::__tls_init();
        local_1e8.fpclass = cpp_dec_float_finite;
        local_1e8.prec_elem = 10;
        local_1e8.data._M_elems[0] = 0;
        local_1e8.data._M_elems[1] = 0;
        local_1e8.data._M_elems[2] = 0;
        local_1e8.data._M_elems[3] = 0;
        local_1e8.data._M_elems[4] = 0;
        local_1e8.data._M_elems[5] = 0;
        local_1e8.data._M_elems._24_5_ = 0;
        local_1e8.data._M_elems[7]._1_3_ = 0;
        local_1e8.data._M_elems._32_5_ = 0;
        local_1e8.data._M_elems[9]._1_3_ = 0;
        local_1e8.exp = 0;
        local_1e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1e8,local_48);
        if (((pcVar1->fpclass == cpp_dec_float_NaN) || (local_1e8.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar1,&local_1e8), -1 < iVar9)) goto LAB_002ada82;
LAB_002adaf8:
        local_e8.data._M_elems._32_5_ =
             SUB85(CONCAT44(local_228.data._M_elems[9],local_228.data._M_elems[8]),0);
        local_e8.data._M_elems[9]._1_3_ = (undefined3)(local_228.data._M_elems[9] >> 8);
        local_e8.data._M_elems[1] = local_228.data._M_elems[1];
        local_e8.data._M_elems[0] = local_228.data._M_elems[0];
        local_e8.data._M_elems[3] = local_228.data._M_elems[3];
        local_e8.data._M_elems[2] = local_228.data._M_elems[2];
        local_e8.data._M_elems[5] = local_228.data._M_elems[5];
        local_e8.data._M_elems[4] = local_228.data._M_elems[4];
        local_e8.data._M_elems._24_5_ =
             SUB85(CONCAT44(local_228.data._M_elems[7],local_228.data._M_elems[6]),0);
        local_e8.data._M_elems[7]._1_3_ = (undefined3)(local_228.data._M_elems[7] >> 8);
        local_e8.exp = local_228.exp;
        local_e8.neg = local_228.neg;
        local_e8.fpclass = local_228.fpclass;
        local_e8.prec_elem = local_228.prec_elem;
      }
LAB_002ada82:
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  *(ulong *)((local_a8->m_backend).data._M_elems + 8) =
       CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
  *(undefined8 *)((local_a8->m_backend).data._M_elems + 4) = local_e8.data._M_elems._16_8_;
  *(ulong *)((local_a8->m_backend).data._M_elems + 6) =
       CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
  *(undefined8 *)(local_a8->m_backend).data._M_elems = local_e8.data._M_elems._0_8_;
  *(undefined8 *)((local_a8->m_backend).data._M_elems + 2) = local_e8.data._M_elems._8_8_;
  (local_a8->m_backend).exp = local_e8.exp;
  (local_a8->m_backend).neg = local_e8.neg;
  (local_a8->m_backend).fpclass = local_e8.fpclass;
  (local_a8->m_backend).prec_elem = local_e8.prec_elem;
  return -1;
}

Assistant:

int SPxHarrisRT<R>::maxDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
)  const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val >= 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x < theval && up[i] < R(infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x < theval && low[i] > R(-infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}